

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

bool __thiscall
llvm::SmallVectorImpl<char>::operator==(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  char *__first1;
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  SmallVectorImpl<char> *RHS_local;
  SmallVectorImpl<char> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)RHS);
  if (sVar2 == sVar3) {
    __first1 = (char *)(this->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
    this_local._7_1_ =
         std::equal<char_const*,char_const*>
                   (__first1,(char *)((long)pvVar1 + sVar2),
                    (char *)(RHS->super_SmallVectorTemplateBase<char,_true>).
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                   );
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const SmallVectorImpl &RHS) const {
    if (this->size() != RHS.size()) return false;
    return std::equal(this->begin(), this->end(), RHS.begin());
  }